

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Result RVar3;
  wabt *this;
  char *out_data;
  string_view filename;
  string_view filename_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  undefined4 local_158;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  Errors errors;
  Features local_102;
  BinaryReaderStrip reader;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)&reader,"wasm-strip",
             "  Remove sections of a WebAssembly binary file.\n\nexamples:\n  # Remove all custom sections from test.wasm\n  $ wasm-strip test.wasm\n"
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178._M_pod_data,"filename",(allocator<char> *)&file_data);
  local_148._M_unused._M_object = (code **)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:44:22)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:44:22)>
              ::_M_manager;
  wabt::OptionParser::AddArgument
            ((OptionParser *)&reader,(string *)&local_178,One,(Callback *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  std::__cxx11::string::_M_dispose();
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:49:20)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:49:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)&reader,'o',"output","FILE","output wasm binary file",
             (Callback *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:52:20)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:52:20)>
              ::_M_manager;
  out_data = "SECTION NAME";
  wabt::OptionParser::AddOption
            ((OptionParser *)&reader,'k',"keep-section","SECTION NAME",
             "Section name to keep in the final output",(Callback *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  wabt::OptionParser::Parse((OptionParser *)&reader,argc,argv);
  wabt::OptionParser::~OptionParser((OptionParser *)&reader);
  _Var1 = s_filename_abi_cxx11_._M_dataplus;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(s_filename_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  if (RVar2.enum_ == Error) {
    RVar2.enum_ = Error;
  }
  else {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_102.exceptions_enabled_ = false;
    local_102.mutable_globals_enabled_ = true;
    local_102.sat_float_to_int_enabled_ = true;
    local_102.sign_extension_enabled_ = true;
    local_102.simd_enabled_ = true;
    local_102.threads_enabled_ = false;
    local_102.function_references_enabled_ = false;
    local_102.multi_value_enabled_ = true;
    local_102.tail_call_enabled_ = false;
    local_102.bulk_memory_enabled_ = true;
    local_102.reference_types_enabled_ = true;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_102.annotations_enabled_ = false;
    local_102.code_metadata_enabled_ = false;
    local_102.gc_enabled_ = false;
    local_102.memory64_enabled_ = false;
    local_102.multi_memory_enabled_ = false;
    local_102.extended_const_enabled_ = false;
    local_102.relaxed_simd_enabled_ = false;
    wabt::Features::EnableAll(&local_102);
    local_168 = (code *)CONCAT62(local_168._2_6_,local_102._16_2_);
    local_178._M_unused._M_member_pointer = CONCAT71(local_102._1_7_,local_102.exceptions_enabled_);
    local_178._8_8_ =
         CONCAT17(local_102.multi_memory_enabled_,
                  CONCAT43(local_102._11_4_,CONCAT21(local_102._9_2_,local_102.tail_call_enabled_)))
    ;
    local_160 = (code *)0x0;
    local_158 = 0x100;
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_Rb_tree(&local_60,&v_sections_to_keep._M_t);
    BinaryReaderStrip::BinaryReaderStrip
              (&reader,(set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)&local_60,&errors);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&local_60);
    RVar3 = wabt::ReadBinary(file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)file_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)file_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                             (BinaryReaderDelegate *)&reader,(ReadBinaryOptions *)&local_178);
    local_148._M_unused._M_object = &local_138;
    local_148._8_8_ = 0;
    local_138 = (code *)((ulong)local_138 & 0xffffffffffffff00);
    RVar2.enum_ = Error;
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_148,Never,0x50);
    std::__cxx11::string::_M_dispose();
    if (RVar3.enum_ != Error) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&s_outfile_abi_cxx11_);
      }
      filename_00._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
      filename_00._M_len = s_outfile_abi_cxx11_._M_string_length;
      RVar2 = wabt::OutputBuffer::WriteToFile
                        ((OutputBuffer *)
                         reader.stream_.buf_._M_t.
                         super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                         .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl,
                         filename_00);
    }
    BinaryReaderStrip::~BinaryReaderStrip(&reader);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return RVar2.enum_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_filename.c_str(), &file_data);
  if (Failed(result)) {
    return Result::Error;
  }

  Errors errors;
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = false;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions options(features, nullptr, kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  BinaryReaderStrip reader(v_sections_to_keep, &errors);
  result = ReadBinary(file_data.data(), file_data.size(), &reader, options);
  FormatErrorsToFile(errors, Location::Type::Binary);
  if (Failed(result)) {
    return Result::Error;
  }

  if (s_outfile.empty()) {
    s_outfile = s_filename;
  }
  return reader.WriteToFile(s_outfile);
}